

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosaraju_scc.cpp
# Opt level: O3

void __thiscall KosarajuSCC::run(KosarajuSCC *this)

{
  pointer *ppvVar1;
  pointer piVar2;
  iterator __position;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *this_00;
  int iVar3;
  int iVar4;
  bool *visited;
  long lVar5;
  size_t __n;
  stack<int,_std::deque<int,_std::allocator<int>_>_> s;
  allocator_type local_99;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_98;
  value_type_conflict1 local_8c;
  _Deque_base<int,_std::allocator<int>_> local_88;
  
  local_8c = -1;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_88,(long)this->nb_nodes,&local_8c,&local_99
            );
  piVar2 = (this->scc).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  (this->scc).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)local_88._M_impl.super__Deque_impl_data._M_map;
  (this->scc).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_88._M_impl.super__Deque_impl_data._M_map_size;
  (this->scc).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  if ((piVar2 != (pointer)0x0) &&
     (operator_delete(piVar2), local_88._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0))
  {
    operator_delete(local_88._M_impl.super__Deque_impl_data._M_map);
  }
  local_98 = &this->sccs;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear(local_98);
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_88,0);
  iVar4 = this->nb_nodes;
  __n = (size_t)iVar4;
  iVar3 = -1;
  if (-1 < iVar4) {
    iVar3 = iVar4;
  }
  visited = (bool *)operator_new__((long)iVar3);
  memset(visited,0,__n);
  if (0 < iVar4) {
    lVar5 = 0;
    do {
      if (visited[lVar5] == false) {
        iVar4 = (*this->_vptr_KosarajuSCC[3])(this);
        if ((char)iVar4 == '\0') {
          fillOrder(this,(int)lVar5,visited,
                    (stack<int,_std::deque<int,_std::allocator<int>_>_> *)&local_88);
        }
      }
      lVar5 = lVar5 + 1;
      __n = (size_t)this->nb_nodes;
    } while (lVar5 < (long)__n);
  }
  iVar4 = 0;
  memset(visited,0,__n);
  this_00 = local_98;
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
        iVar3 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x7f];
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_finish._M_first);
        local_88._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_88._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x80;
        local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x7f;
        local_88._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        iVar3 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur[-1];
        local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      if (visited[iVar3] == false) {
        __position._M_current =
             (this->sccs).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->sccs).
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::_M_realloc_insert<>(this_00,__position);
        }
        else {
          ((__position._M_current)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((__position._M_current)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ((__position._M_current)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ppvVar1 = &(this->sccs).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppvVar1 = *ppvVar1 + 1;
        }
        DFS(this,iVar3,visited,iVar4);
        iVar4 = iVar4 + 1;
      }
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  operator_delete__(visited);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_88);
  return;
}

Assistant:

void KosarajuSCC::run() {
	scc = std::vector<int>(nb_nodes, -1);
	sccs.clear();
	std::stack<int> s;

	// Mark all the vertices as not visited (For first DFS)
	bool* visited = new bool[nb_nodes];
	memset(visited, 0, nb_nodes * sizeof(bool));
	// Fill vertices in stack according to their finishing times
	for (int i = 0; i < nb_nodes; i++) {
		if (visited[i] == false && !ignore_node(i)) {
			fillOrder(i, visited, s);
		}
	}

	// Mark all the vertices as not visited (For second DFS)
	memset(visited, 0, nb_nodes * sizeof(bool));

	// Now process all vertices in order defined by Stack
	int curr = 0;
	while (!s.empty()) {
		// Pop a vertex from stack
		const int v = s.top();
		s.pop();

		// Print Strongly connected component of the popped vertex
		if (visited[v] == false) {
			sccs.emplace_back();
			DFS(v, visited, curr);
			curr++;
		}
	}
	delete[] visited;
}